

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__seek_bits(ma_dr_flac_bs *bs,size_t bitsToSeek)

{
  ma_bool32 mVar1;
  ma_dr_flac_cache_t mVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ma_uint8 bin_1;
  ma_uint8 bin;
  
  uVar3 = 0x40 - (ulong)bs->consumedBits;
  uVar6 = bitsToSeek - uVar3;
  if (bitsToSeek < uVar3 || uVar6 == 0) {
    bs->consumedBits = bs->consumedBits + (int)bitsToSeek;
    bs->cache = bs->cache << ((byte)bitsToSeek & 0x3f);
LAB_0018407a:
    mVar1 = 1;
  }
  else {
    bs->consumedBits = 0x40;
    bs->cache = 0;
    for (; 0x3f < uVar6; uVar6 = uVar6 - 0x40) {
      uVar4 = bs->consumedBits;
      if (uVar4 == 0x40) {
        mVar1 = ma_dr_flac__reload_cache(bs);
        if (mVar1 == 0) goto LAB_001840a2;
        uVar4 = bs->consumedBits;
      }
      if (0x40 - (ulong)uVar4 < 0x20) {
        mVar1 = ma_dr_flac__reload_cache(bs);
        if (mVar1 == 0) {
          return 0;
        }
        uVar5 = 0x20 - (int)(0x40 - (ulong)uVar4);
        if (0x40 - (ulong)bs->consumedBits < (ulong)uVar5) {
          return 0;
        }
        uVar4 = bs->consumedBits + uVar5;
        bs->consumedBits = uVar4;
        mVar2 = bs->cache << ((byte)uVar5 & 0x3f);
      }
      else {
        uVar4 = uVar4 + 0x20;
        bs->consumedBits = uVar4;
        mVar2 = bs->cache << 0x20;
      }
      bs->cache = mVar2;
      if (uVar4 == 0x40) {
        mVar1 = ma_dr_flac__reload_cache(bs);
        if (mVar1 == 0) goto LAB_001840a2;
        uVar4 = bs->consumedBits;
      }
      if (0x40 - (ulong)uVar4 < 0x20) {
        mVar1 = ma_dr_flac__reload_cache(bs);
        if (mVar1 == 0) {
          return 0;
        }
        uVar4 = 0x20 - (int)(0x40 - (ulong)uVar4);
        if (0x40 - (ulong)bs->consumedBits < (ulong)uVar4) {
          return 0;
        }
        bs->consumedBits = bs->consumedBits + uVar4;
        mVar2 = bs->cache << ((byte)uVar4 & 0x3f);
      }
      else {
        bs->consumedBits = uVar4 + 0x20;
        mVar2 = bs->cache << 0x20;
      }
      bs->cache = mVar2;
    }
    do {
      if (uVar6 < 8) {
        if ((uVar6 == 0) || (mVar1 = ma_dr_flac__read_uint8(bs,(uint)uVar6,&bin_1), mVar1 != 0))
        goto LAB_0018407a;
        break;
      }
      mVar1 = ma_dr_flac__read_uint8(bs,8,&bin);
      uVar6 = uVar6 - 8;
    } while (mVar1 != 0);
LAB_001840a2:
    mVar1 = 0;
  }
  return mVar1;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_bits(ma_dr_flac_bs* bs, size_t bitsToSeek)
{
    if (bitsToSeek <= MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs)) {
        bs->consumedBits += (ma_uint32)bitsToSeek;
        bs->cache <<= bitsToSeek;
        return MA_TRUE;
    } else {
        bitsToSeek       -= MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs);
        bs->consumedBits += MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs);
        bs->cache         = 0;
#ifdef MA_64BIT
        while (bitsToSeek >= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs)) {
            ma_uint64 bin;
            if (!ma_dr_flac__read_uint64(bs, MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs), &bin)) {
                return MA_FALSE;
            }
            bitsToSeek -= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs);
        }
#else
        while (bitsToSeek >= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs)) {
            ma_uint32 bin;
            if (!ma_dr_flac__read_uint32(bs, MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs), &bin)) {
                return MA_FALSE;
            }
            bitsToSeek -= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs);
        }
#endif
        while (bitsToSeek >= 8) {
            ma_uint8 bin;
            if (!ma_dr_flac__read_uint8(bs, 8, &bin)) {
                return MA_FALSE;
            }
            bitsToSeek -= 8;
        }
        if (bitsToSeek > 0) {
            ma_uint8 bin;
            if (!ma_dr_flac__read_uint8(bs, (ma_uint32)bitsToSeek, &bin)) {
                return MA_FALSE;
            }
            bitsToSeek = 0;
        }
        MA_DR_FLAC_ASSERT(bitsToSeek == 0);
        return MA_TRUE;
    }
}